

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O2

void __thiscall
PDA::Transducer::Grammar::Rule::addChains<wchar_t[4],wchar_t[5],wchar_t[7],wchar_t[7]>
          (Rule *this,wchar_t (*first) [4],wchar_t (*rest) [5],wchar_t (*rest_1) [7],
          wchar_t (*rest_2) [7])

{
  allocator<wchar_t> local_69;
  Chain local_68;
  wstring local_48 [32];
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,*first,&local_69);
  std::__cxx11::wstring::wstring((wstring *)&local_68,local_48);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  emplace_back<PDA::Transducer::Grammar::Chain>(&this->m_chains,&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  std::__cxx11::wstring::~wstring(local_48);
  addChains<wchar_t[5],wchar_t[7],wchar_t[7]>(this,rest,rest_1,rest_2);
  return;
}

Assistant:

void addChains(const First &first, const Rest&... rest)
        {
            m_chains.push_back(Chain(first));
            addChains(rest...);
        }